

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params_dup.c
# Opt level: O0

int ossl_param_buf_alloc(OSSL_PARAM_BUF *out,size_t extra_blocks,int is_secure)

{
  char *file;
  char *func;
  int in_EDX;
  int iVar1;
  long in_RSI;
  long *in_RDI;
  size_t sz;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  file = (char *)((in_RSI + in_RDI[2]) * 8);
  if (in_EDX == 0) {
    func = (char *)CRYPTO_zalloc((ulong)in_stack_ffffffffffffffe0,file,
                                 (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  else {
    func = (char *)CRYPTO_secure_zalloc
                             ((size_t)file,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  *in_RDI = (long)func;
  if (*in_RDI == 0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),(int)((ulong)file >> 0x20),func
                 );
    _iVar1 = 0xc0100;
    if (in_EDX != 0) {
      _iVar1 = 0x6f;
    }
    ERR_set_error(0xf,_iVar1,(char *)0x0);
    local_4 = 0;
  }
  else {
    in_RDI[3] = (long)file;
    in_RDI[1] = *in_RDI + in_RSI * 8;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ossl_param_buf_alloc(OSSL_PARAM_BUF *out, size_t extra_blocks,
                                int is_secure)
{
    size_t sz = OSSL_PARAM_ALIGN_SIZE * (extra_blocks + out->blocks);

    out->alloc = is_secure ? OPENSSL_secure_zalloc(sz) : OPENSSL_zalloc(sz);
    if (out->alloc == NULL) {
        ERR_raise(ERR_LIB_CRYPTO, is_secure ? CRYPTO_R_SECURE_MALLOC_FAILURE
                                            : ERR_R_MALLOC_FAILURE);
        return 0;
    }
    out->alloc_sz = sz;
    out->cur = out->alloc + extra_blocks;
    return 1;
}